

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcTrimmedCurve::IfcTrimmedCurve(IfcTrimmedCurve *this)

{
  IfcTrimmedCurve *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xc8,"IfcTrimmedCurve");
  IfcBoundedCurve::IfcBoundedCurve
            (&this->super_IfcBoundedCurve,&PTR_construction_vtable_24__00f798e0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcTrimmedCurve,_5UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcTrimmedCurve,_5UL> *)
             &(this->super_IfcBoundedCurve).super_IfcCurve.field_0x40,
             &PTR_construction_vtable_24__00f79990);
  (this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf79800;
  *(undefined8 *)&this->field_0xc8 = 0xf798c8;
  *(undefined8 *)
   &(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf79828;
  *(undefined8 *)
   &(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf79850;
  *(undefined8 *)
   &(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.field_0x30 =
       0xf79878;
  *(undefined8 *)&(this->super_IfcBoundedCurve).super_IfcCurve.field_0x40 = 0xf798a0;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcCurve> *)&(this->super_IfcBoundedCurve).field_0x50,
             (LazyObject *)0x0);
  STEP::ListOf<Assimp::STEP::EXPRESS::DataType,_1UL,_2UL>::ListOf(&this->Trim1);
  STEP::ListOf<Assimp::STEP::EXPRESS::DataType,_1UL,_2UL>::ListOf(&this->Trim2);
  std::__cxx11::string::string((string *)&this->SenseAgreement);
  std::__cxx11::string::string((string *)&this->MasterRepresentation);
  return;
}

Assistant:

IfcTrimmedCurve() : Object("IfcTrimmedCurve") {}